

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

bool __thiscall spvtools::opt::IRContext::IsConsistent(IRContext *this)

{
  Module *pMVar1;
  pointer puVar2;
  tuple<spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_> this_00;
  __uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
  _Var3;
  undefined8 *puVar4;
  bool bVar5;
  Analysis AVar6;
  uint32_t uVar7;
  DefUseManager *lhs;
  mapped_type *ppFVar8;
  DecorationManager *lhs_00;
  pointer puVar9;
  undefined8 *puVar10;
  DefUseManager new_def_use;
  
  AVar6 = this->valid_analyses_;
  if ((AVar6 & kAnalysisBegin) != kAnalysisNone) {
    analysis::DefUseManager::DefUseManager
              (&new_def_use,
               (this->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
    lhs = get_def_use_mgr(this);
    bVar5 = analysis::CompareAndPrintDifferences(lhs,&new_def_use);
    analysis::DefUseManager::~DefUseManager(&new_def_use);
    if (!bVar5) {
      return false;
    }
    AVar6 = this->valid_analyses_;
  }
  if ((AVar6 >> 0xd & 1) == 0) {
LAB_00204ee9:
    if ((AVar6 & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
      pMVar1 = (this->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
      puVar2 = *(pointer *)
                ((long)&(pMVar1->functions_).
                        super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                + 8);
      for (puVar9 = *(pointer *)
                     &(pMVar1->functions_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                      ._M_impl; puVar9 != puVar2; puVar9 = puVar9 + 1) {
        _Var3.
        super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
        .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
             (puVar9->_M_t).
             super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ;
        puVar10 = *(undefined8 **)
                   ((long)_Var3.
                          super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                          .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl +
                   0x98);
        puVar4 = *(undefined8 **)
                  ((long)_Var3.
                         super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                         .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl +
                  0xa0);
        while (puVar10 != puVar4) {
          new_def_use.id_to_def_._M_h._M_bucket_count = *puVar10;
          new_def_use.id_to_def_._M_h._M_element_count =
               (size_type)
               std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.cpp:394:34)>
               ::_M_invoke;
          new_def_use.id_to_def_._M_h._M_before_begin._M_nxt =
               (_Hash_node_base *)
               std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.cpp:394:34)>
               ::_M_manager;
          new_def_use.id_to_def_._M_h._M_buckets = (__buckets_ptr)this;
          bVar5 = BasicBlock::WhileEachInst
                            ((BasicBlock *)new_def_use.id_to_def_._M_h._M_bucket_count,
                             (function<bool_(spvtools::opt::Instruction_*)> *)&new_def_use,false);
          if (new_def_use.id_to_def_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
            (*(code *)new_def_use.id_to_def_._M_h._M_before_begin._M_nxt)
                      (&new_def_use,&new_def_use,3);
          }
          puVar10 = puVar10 + 1;
          if (!bVar5) {
            return false;
          }
        }
      }
    }
    bVar5 = CheckCFG(this);
    if (bVar5) {
      if ((this->valid_analyses_ & kAnalysisDecorations) != kAnalysisNone) {
        lhs_00 = get_decoration_mgr(this);
        analysis::DecorationManager::DecorationManager
                  ((DecorationManager *)&new_def_use,
                   (this->module_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                   .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
        bVar5 = analysis::operator!=(lhs_00,(DecorationManager *)&new_def_use);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&new_def_use);
        if (bVar5) {
          return false;
        }
      }
      if ((this->feature_mgr_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
          .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl !=
          (FeatureManager *)0x0) {
        FeatureManager::FeatureManager((FeatureManager *)&new_def_use,&this->grammar_);
        FeatureManager::Analyze
                  ((FeatureManager *)&new_def_use,
                   (this->module_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                   .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
        bVar5 = operator!=((FeatureManager *)&new_def_use,
                           (this->feature_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>.
                           _M_head_impl);
        FeatureManager::~FeatureManager((FeatureManager *)&new_def_use);
        if (bVar5) {
          return false;
        }
      }
      return true;
    }
  }
  else {
    pMVar1 = (this->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    puVar9 = *(pointer *)
              &(pMVar1->functions_).
               super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
               ._M_impl;
    puVar2 = *(pointer *)
              ((long)&(pMVar1->functions_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
              + 8);
    do {
      if (puVar9 == puVar2) {
        AVar6 = this->valid_analyses_;
        goto LAB_00204ee9;
      }
      this_00.
      super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
      .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
             *)&(puVar9->_M_t).
                super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
      ;
      uVar7 = Function::result_id((Function *)
                                  this_00.
                                  super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                                  .super__Head_base<0UL,_spvtools::opt::Function_*,_false>.
                                  _M_head_impl);
      new_def_use.id_to_def_._M_h._M_buckets =
           (__buckets_ptr)CONCAT44(new_def_use.id_to_def_._M_h._M_buckets._4_4_,uVar7);
      ppFVar8 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->id_to_func_,(key_type *)&new_def_use);
      puVar9 = puVar9 + 1;
    } while ((_Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
              )*ppFVar8 ==
             (_Head_base<0UL,_spvtools::opt::Function_*,_false>)
             this_00.
             super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
             .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl);
  }
  return false;
}

Assistant:

bool IRContext::IsConsistent() {
#ifndef SPIRV_CHECK_CONTEXT
  return true;
#else
  if (AreAnalysesValid(kAnalysisDefUse)) {
    analysis::DefUseManager new_def_use(module());
    if (!CompareAndPrintDifferences(*get_def_use_mgr(), new_def_use)) {
      return false;
    }
  }

  if (AreAnalysesValid(kAnalysisIdToFuncMapping)) {
    for (auto& fn : *module_) {
      if (id_to_func_[fn.result_id()] != &fn) {
        return false;
      }
    }
  }

  if (AreAnalysesValid(kAnalysisInstrToBlockMapping)) {
    for (auto& func : *module()) {
      for (auto& block : func) {
        if (!block.WhileEachInst([this, &block](Instruction* inst) {
              if (get_instr_block(inst) != &block) {
                return false;
              }
              return true;
            }))
          return false;
      }
    }
  }

  if (!CheckCFG()) {
    return false;
  }

  if (AreAnalysesValid(kAnalysisDecorations)) {
    analysis::DecorationManager* dec_mgr = get_decoration_mgr();
    analysis::DecorationManager current(module());

    if (*dec_mgr != current) {
      return false;
    }
  }

  if (feature_mgr_ != nullptr) {
    FeatureManager current(grammar_);
    current.Analyze(module());

    if (current != *feature_mgr_) {
      return false;
    }
  }
  return true;
#endif
}